

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

void __thiscall
kj::anon_unknown_31::HttpClientAdapter::ResponseImpl::~ResponseImpl(ResponseImpl *this)

{
  PromiseNode *pPVar1;
  Disposer *pDVar2;
  PromiseFulfiller<kj::HttpClient::Response> *pPVar3;
  
  pPVar1 = (this->task).super_PromiseBase.node.ptr;
  if (pPVar1 != (PromiseNode *)0x0) {
    (this->task).super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    pDVar2 = (this->task).super_PromiseBase.node.disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
  }
  pPVar3 = (this->fulfiller).ptr;
  if (pPVar3 != (PromiseFulfiller<kj::HttpClient::Response> *)0x0) {
    (this->fulfiller).ptr = (PromiseFulfiller<kj::HttpClient::Response> *)0x0;
    pDVar2 = (this->fulfiller).disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,pPVar3->_vptr_PromiseFulfiller[-2] + (long)&pPVar3->_vptr_PromiseFulfiller);
  }
  Refcounted::~Refcounted(&this->super_Refcounted);
  operator_delete(this,0x38);
  return;
}

Assistant:

ResponseImpl(kj::HttpMethod method,
                 kj::Own<kj::PromiseFulfiller<HttpClient::Response>> fulfiller)
        : method(method), fulfiller(kj::mv(fulfiller)) {}